

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::ast::Expression*>::emplace_back<slang::ast::Expression*const&>
          (SmallVectorBase<slang::ast::Expression*> *this,Expression **args)

{
  iterator ppEVar1;
  Expression **args_local;
  SmallVectorBase<slang::ast::Expression_*> *this_local;
  
  if (*(long *)(this + 8) == *(long *)(this + 0x10)) {
    ppEVar1 = SmallVectorBase<slang::ast::Expression_*>::end
                        ((SmallVectorBase<slang::ast::Expression_*> *)this);
    this_local = (SmallVectorBase<slang::ast::Expression_*> *)
                 emplaceRealloc<slang::ast::Expression*const&>(this,ppEVar1,args);
  }
  else {
    ppEVar1 = SmallVectorBase<slang::ast::Expression_*>::end
                        ((SmallVectorBase<slang::ast::Expression_*> *)this);
    *ppEVar1 = *args;
    *(long *)(this + 8) = *(long *)(this + 8) + 1;
    this_local = (SmallVectorBase<slang::ast::Expression_*> *)
                 SmallVectorBase<slang::ast::Expression_*>::back
                           ((SmallVectorBase<slang::ast::Expression_*> *)this);
  }
  return (reference)this_local;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }